

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram.cpp
# Opt level: O3

void duckdb_brotli::BrotliBuildHistogramsWithContext
               (Command *cmds,size_t num_commands,BlockSplit *literal_split,
               BlockSplit *insert_and_copy_split,BlockSplit *dist_split,uint8_t *ringbuffer,
               size_t start_pos,size_t mask,uint8_t prev_byte,uint8_t prev_byte2,
               ContextType *context_modes,HistogramLiteral *literal_histograms,
               HistogramCommand *insert_and_copy_histograms,HistogramDistance *copy_dist_histograms)

{
  long lVar1;
  ushort uVar2;
  uint *puVar3;
  uint *puVar4;
  uint *puVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  size_t sVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  Command *pCVar14;
  long lVar15;
  ulong local_b0;
  long local_98;
  ulong local_88;
  long local_80;
  ulong local_68;
  
  puVar3 = literal_split->lengths;
  if (puVar3 == (uint *)0x0) {
    uVar13 = 0;
  }
  else {
    uVar13 = (ulong)*puVar3;
  }
  puVar4 = insert_and_copy_split->lengths;
  if (puVar4 == (uint *)0x0) {
    local_68 = 0;
  }
  else {
    local_68 = (ulong)*puVar4;
  }
  puVar5 = dist_split->lengths;
  if (puVar5 == (uint *)0x0) {
    local_b0 = 0;
  }
  else {
    local_b0 = (ulong)*puVar5;
  }
  if (num_commands != 0) {
    sVar9 = 0;
    lVar15 = 0;
    local_88 = 0;
    local_98 = 0;
    uVar7 = 0;
    local_80 = 0;
    uVar10 = 0;
    do {
      if (local_68 == 0) {
        uVar7 = (ulong)insert_and_copy_split->types[local_80 + 1];
        local_68 = (ulong)puVar4[local_80 + 1];
        local_80 = local_80 + 1;
      }
      pCVar14 = cmds + sVar9;
      uVar2 = pCVar14->cmd_prefix_;
      insert_and_copy_histograms[uVar7].data_[uVar2] =
           insert_and_copy_histograms[uVar7].data_[uVar2] + 1;
      insert_and_copy_histograms[uVar7].total_count_ =
           insert_and_copy_histograms[uVar7].total_count_ + 1;
      for (uVar8 = (ulong)pCVar14->insert_len_; uVar8 != 0; uVar8 = uVar8 - 1) {
        if (uVar13 == 0) {
          uVar10 = (ulong)literal_split->types[lVar15 + 1];
          uVar13 = (ulong)puVar3[lVar15 + 1];
          lVar15 = lVar15 + 1;
        }
        uVar11 = uVar10;
        if (context_modes != (ContextType *)0x0) {
          uVar11 = (ulong)(byte)((&_kBrotliContextLookupTable)
                                 [(ulong)prev_byte2 + 0x100 +
                                  (long)(int)(context_modes[uVar10] << 9)] |
                                (&_kBrotliContextLookupTable)
                                [(ulong)prev_byte + (long)(int)(context_modes[uVar10] << 9)]) +
                   uVar10 * 0x40;
        }
        uVar12 = start_pos & mask;
        literal_histograms[uVar11].data_[ringbuffer[uVar12]] =
             literal_histograms[uVar11].data_[ringbuffer[uVar12]] + 1;
        uVar13 = uVar13 - 1;
        literal_histograms[uVar11].total_count_ = literal_histograms[uVar11].total_count_ + 1;
        start_pos = start_pos + 1;
        prev_byte2 = prev_byte;
        prev_byte = ringbuffer[uVar12];
      }
      uVar8 = (ulong)(pCVar14->copy_len_ & 0x1ffffff);
      start_pos = start_pos + uVar8;
      if (uVar8 != 0) {
        prev_byte2 = ringbuffer[start_pos - 2 & mask];
        prev_byte = ringbuffer[start_pos - 1 & mask];
        if (0x7f < uVar2) {
          if (local_b0 == 0) {
            local_88 = (ulong)dist_split->types[local_98 + 1];
            local_b0 = (ulong)puVar5[local_98 + 1];
            local_98 = local_98 + 1;
          }
          local_b0 = local_b0 - 1;
          uVar6 = uVar2 & 7;
          if (2 < (uVar2 & 7)) {
            uVar6 = 3;
          }
          uVar8 = 3;
          if (((uVar2 >> 6) - 2 & 0xfffffffd) == 0) {
            uVar8 = (ulong)uVar6;
          }
          if (uVar2 >> 6 == 7) {
            uVar8 = (ulong)uVar6;
          }
          lVar1 = uVar8 + local_88 * 4;
          copy_dist_histograms[lVar1].data_[pCVar14->dist_prefix_ & 0x3ff] =
               copy_dist_histograms[lVar1].data_[pCVar14->dist_prefix_ & 0x3ff] + 1;
          copy_dist_histograms[lVar1].total_count_ = copy_dist_histograms[lVar1].total_count_ + 1;
        }
      }
      local_68 = local_68 - 1;
      sVar9 = sVar9 + 1;
    } while (sVar9 != num_commands);
  }
  return;
}

Assistant:

void duckdb_brotli::BrotliBuildHistogramsWithContext(
    const Command* cmds, const size_t num_commands,
    const BlockSplit* literal_split, const BlockSplit* insert_and_copy_split,
    const BlockSplit* dist_split, const uint8_t* ringbuffer, size_t start_pos,
    size_t mask, uint8_t prev_byte, uint8_t prev_byte2,
    const ContextType* context_modes, HistogramLiteral* literal_histograms,
    HistogramCommand* insert_and_copy_histograms,
    HistogramDistance* copy_dist_histograms) {
  size_t pos = start_pos;
  BlockSplitIterator literal_it;
  BlockSplitIterator insert_and_copy_it;
  BlockSplitIterator dist_it;
  size_t i;

  InitBlockSplitIterator(&literal_it, literal_split);
  InitBlockSplitIterator(&insert_and_copy_it, insert_and_copy_split);
  InitBlockSplitIterator(&dist_it, dist_split);
  for (i = 0; i < num_commands; ++i) {
    const Command* cmd = &cmds[i];
    size_t j;
    BlockSplitIteratorNext(&insert_and_copy_it);
    HistogramAddCommand(&insert_and_copy_histograms[insert_and_copy_it.type_],
        cmd->cmd_prefix_);
    /* TODO(eustas): unwrap iterator blocks. */
    for (j = cmd->insert_len_; j != 0; --j) {
      size_t context;
      BlockSplitIteratorNext(&literal_it);
      context = literal_it.type_;
      if (context_modes) {
        ContextLut lut = BROTLI_CONTEXT_LUT(context_modes[context]);
        context = (context << BROTLI_LITERAL_CONTEXT_BITS) +
            BROTLI_CONTEXT(prev_byte, prev_byte2, lut);
      }
      HistogramAddLiteral(&literal_histograms[context],
          ringbuffer[pos & mask]);
      prev_byte2 = prev_byte;
      prev_byte = ringbuffer[pos & mask];
      ++pos;
    }
    pos += CommandCopyLen(cmd);
    if (CommandCopyLen(cmd)) {
      prev_byte2 = ringbuffer[(pos - 2) & mask];
      prev_byte = ringbuffer[(pos - 1) & mask];
      if (cmd->cmd_prefix_ >= 128) {
        size_t context;
        BlockSplitIteratorNext(&dist_it);
        context = (dist_it.type_ << BROTLI_DISTANCE_CONTEXT_BITS) +
            CommandDistanceContext(cmd);
        HistogramAddDistance(&copy_dist_histograms[context],
            cmd->dist_prefix_ & 0x3FF);
      }
    }
  }
}